

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runstat.c
# Opt level: O0

void runstat(void)

{
  runsdef *prVar1;
  int state;
  int iVar2;
  int savemoremode;
  objnum locobj;
  prpnum in_stack_00000190;
  objnum in_stack_00000192;
  prpnum in_stack_00000194;
  objnum in_stack_00000196;
  uchar **in_stack_00000198;
  runcxdef *in_stack_000001a0;
  int in_stack_000001b0;
  int in_stack_000001b8;
  objnum in_stack_000001c0;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar3 = 0;
  runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,in_stack_00000192
           ,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,in_stack_000001c0);
  if (runctx->runcxsp[-1].runstyp == '\x02') {
    prVar1 = runctx->runcxsp;
    runctx->runcxsp = prVar1 + -1;
    if (prVar1[-1].runstyp != '\x02') {
      runctx->runcxerr->errcxptr->erraac = 0;
      runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),in_stack_ffffffffffffffdc);
    }
    outflushn(0);
    os_status(0);
    state = setmore(0);
    uVar3 = 0;
    runpprop(in_stack_000001a0,in_stack_00000198,in_stack_00000196,in_stack_00000194,
             in_stack_00000192,in_stack_00000190,in_stack_000001b0,in_stack_000001b8,
             in_stack_000001c0);
    iVar2 = os_get_status();
    if (iVar2 != 0) {
      outformat((char *)CONCAT44(in_stack_ffffffffffffffe4,uVar3));
    }
    outflushn(0);
    setmore(state);
    os_status(0);
  }
  else {
    runctx->runcxsp = runctx->runcxsp + -1;
  }
  return;
}

Assistant:

void runstat(void)
{
    objnum  locobj;
    int     savemoremode;

    /* get the location of the Me object */
    runppr(runctx, vocctx->voccxme, PRP_LOCATION, 0);

    /* if that's no an object, there's nothing we can do */
    if (runtostyp(runctx) != DAT_OBJECT)
    {
        rundisc(runctx);
        return;
    }

    /* get Me.location */
    locobj = runpopobj(runctx);

    /* flush any pending output */
    outflushn(0);

    /* switch to output display mode 1 (status line) */
    os_status(1);

    /* turn off MORE mode */
    savemoremode = setmore(0);

    /* call the statusLine method of the current room */
    runppr(runctx, locobj, PRP_STATUSLINE, 0);

    /* if we're in the status line, make sure the line gets flushed */
    if (os_get_status() != 0)
        tioputs(tioctx, "\\n");
    outflushn(0);

    /* restore the previous MORE mode */
    setmore(savemoremode);

    /* switch to output display mode 0 (main text area) */
    os_status(0);
}